

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer_next.cpp
# Opt level: O3

unique_ptr<pfederc::Token,_std::default_delete<pfederc::Token>_> __thiscall
pfederc::Lexer::nextTokenEOF(Lexer *this)

{
  Token *this_00;
  Lexer *in_RSI;
  Position local_48;
  Position local_30;
  
  getCurrentCursor(&local_30,in_RSI);
  local_48.startIndex = (in_RSI->fileContent)._M_string_length - 1;
  local_48.line = local_30.line;
  local_48.endIndex = local_48.startIndex;
  this_00 = (Token *)operator_new(0x30);
  Token::Token(this_00,in_RSI->currentToken,TOK_EOF,&local_48);
  this->_vptr_Lexer = (_func_int **)this_00;
  return (__uniq_ptr_data<pfederc::Token,_std::default_delete<pfederc::Token>,_true,_true>)
         (__uniq_ptr_data<pfederc::Token,_std::default_delete<pfederc::Token>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Token> Lexer::nextTokenEOF() noexcept {
  return std::make_unique<Token>(currentToken, TokenType::TOK_EOF, 
    Position{getCurrentCursor().line, getFileContent().length() - 1,
      getFileContent().length() - 1});
}